

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O2

double __thiscall
duckdb::WindowQuantileState<long>::WindowScalar<double,false>
          (WindowQuantileState<long> *this,CursorType *data,SubFrames *frames,idx_t n,Vector *result
          ,QuantileValue *q)

{
  long lVar1;
  vector<std::pair<unsigned_long,_long>,_true> *dest_00;
  size_t sVar2;
  pointer this_00;
  pointer pHVar3;
  reference pvVar4;
  InternalException *this_01;
  ulong index;
  ulong uVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  Interpolator<false> interp;
  array<long,_2UL> dest;
  
  if ((QuantileSortTree *)
      (this->qst).
      super_unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::QuantileSortTree_*,_std::default_delete<duckdb::QuantileSortTree>_>
      .super__Head_base<0UL,_duckdb::QuantileSortTree_*,_false> != (QuantileSortTree *)0x0) {
    this_00 = unique_ptr<duckdb::QuantileSortTree,_std::default_delete<duckdb::QuantileSortTree>,_true>
              ::operator->(&this->qst);
    dVar6 = QuantileSortTree::WindowScalar<long,double,false>(this_00,data,frames,n,result,q);
    return dVar6;
  }
  if ((this->s).
      super_unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_*,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>_>
      .
      super__Head_base<0UL,_duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_*,_false>
      ._M_head_impl !=
      (HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>
       *)0x0) {
    pHVar3 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>,_true>
             ::operator->(&this->s);
    sVar2 = pHVar3->_count;
    interp.desc = false;
    lVar1 = sVar2 - 1;
    auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
    auVar8._0_8_ = lVar1;
    auVar8._12_4_ = 0x45300000;
    dVar6 = ((auVar8._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0)) * q->dbl;
    interp.RN = dVar6;
    dVar7 = floor(dVar6);
    index = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    interp.FRN = index;
    dVar6 = ceil(dVar6);
    uVar5 = (long)(dVar6 - 9.223372036854776e+18) & (long)dVar6 >> 0x3f | (long)dVar6;
    interp.begin = 0;
    interp.CRN = uVar5;
    interp.end = sVar2;
    pHVar3 = unique_ptr<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>,_std::default_delete<duckdb_skiplistlib::skip_list::HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>_>,_true>
             ::operator->(&this->s);
    dest_00 = &this->skips;
    duckdb_skiplistlib::skip_list::
    HeadNode<std::pair<unsigned_long,_long>,_duckdb::SkipLess<std::pair<unsigned_long,_long>_>_>::at
              (pHVar3,index,(uVar5 - index) + 1,
               &dest_00->
                super_vector<std::pair<unsigned_long,_long>,_std::allocator<std::pair<unsigned_long,_long>_>_>
              );
    pvVar4 = vector<std::pair<unsigned_long,_long>,_true>::get<true>(dest_00,0);
    dest._M_elems[0] = pvVar4->second;
    pvVar4 = vector<std::pair<unsigned_long,_long>,_true>::get<true>
                       (dest_00,(ulong)(0x10 < (ulong)((long)(this->skips).
                                                                                                                          
                                                  super_vector<std::pair<unsigned_long,_long>,_std::allocator<std::pair<unsigned_long,_long>_>_>
                                                  .
                                                  super__Vector_base<std::pair<unsigned_long,_long>,_std::allocator<std::pair<unsigned_long,_long>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(this->skips).
                                                                                                                
                                                  super_vector<std::pair<unsigned_long,_long>,_std::allocator<std::pair<unsigned_long,_long>_>_>
                                                  .
                                                  super__Vector_base<std::pair<unsigned_long,_long>,_std::allocator<std::pair<unsigned_long,_long>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)));
    dest._M_elems[1] = pvVar4->second;
    dVar6 = Interpolator<false>::Extract<long,double>(&interp,dest._M_elems,result);
    return dVar6;
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&interp,"No accelerator for scalar QUANTILE",(allocator *)&dest);
  duckdb::InternalException::InternalException(this_01,(string *)&interp);
  __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

RESULT_TYPE WindowScalar(CursorType &data, const SubFrames &frames, const idx_t n, Vector &result,
	                         const QuantileValue &q) const {
		D_ASSERT(n > 0);
		if (qst) {
			return qst->WindowScalar<INPUT_TYPE, RESULT_TYPE, DISCRETE>(data, frames, n, result, q);
		} else if (s) {
			// Find the position(s) needed
			try {
				Interpolator<DISCRETE> interp(q, s->size(), false);
				s->at(interp.FRN, interp.CRN - interp.FRN + 1, skips);
				array<INPUT_TYPE, 2> dest;
				dest[0] = skips[0].second;
				if (skips.size() > 1) {
					dest[1] = skips[1].second;
				} else {
					// Avoid UMA
					dest[1] = skips[0].second;
				}
				return interp.template Extract<INPUT_TYPE, RESULT_TYPE>(dest.data(), result);
			} catch (const duckdb_skiplistlib::skip_list::IndexError &idx_err) {
				throw InternalException(idx_err.message());
			}
		} else {
			throw InternalException("No accelerator for scalar QUANTILE");
		}
	}